

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O3

Vec_Int_t * findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone,Vec_Int_t *vHintMonotone)

{
  int iVar1;
  Vec_Int_t *p;
  long lVar2;
  long lVar3;
  
  p = vHintMonotone;
  if ((vKnownMonotone != (Vec_Int_t *)0x0) && (0 < vKnownMonotone->nSize)) {
    p = (Vec_Int_t *)calloc(1,0x10);
    iVar1 = vHintMonotone->nSize;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        if (0 < (long)vKnownMonotone->nSize) {
          lVar2 = 0;
          do {
            if (vKnownMonotone->pArray[lVar2] == vHintMonotone->pArray[lVar3]) goto LAB_00902d95;
            lVar2 = lVar2 + 1;
          } while (vKnownMonotone->nSize != lVar2);
        }
        Vec_IntPush(p,vHintMonotone->pArray[lVar3]);
        iVar1 = vHintMonotone->nSize;
LAB_00902d95:
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t *findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone, Vec_Int_t *vHintMonotone)
{
    Vec_Int_t *vCandMonotone;
    int iElem, i;

    if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
        return vHintMonotone;
    vCandMonotone = Vec_IntAlloc(0);
    Vec_IntForEachEntry( vHintMonotone, iElem, i )
    {
        if( Vec_IntFind( vKnownMonotone, iElem ) == -1 )
            Vec_IntPush( vCandMonotone, iElem );
    }
    
    return vCandMonotone;
}